

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

bool __thiscall
deqp::egl::Image::GLES2ImageApi::ModifyTexSubImage::invokeGLES2
          (ModifyTexSubImage *this,GLES2ImageApi *api,
          MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *img,
          Texture2D *reference)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  Functions *gl;
  GLenum GVar2;
  int height;
  int width;
  Texture srcTex;
  Texture2D src;
  ConstPixelBufferAccess *local_1c8;
  float afStack_1c0 [2];
  MessageBuilder local_1b8;
  
  pTVar1 = (api->super_CallLogWrapper).m_log;
  gl = api->m_gl;
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper(&srcTex,gl);
  width = reference->m_width + -8;
  if (0xf < width) {
    width = 0x10;
  }
  height = reference->m_height + -0x10;
  if (0xf < height) {
    height = 0x10;
  }
  local_1b8.m_log = (TestLog *)glu::mapGLTransferFormat(this->m_format,this->m_type);
  tcu::Texture2D::Texture2D(&src,(TextureFormat *)&local_1b8,width,height);
  this_00 = &local_1b8.m_str;
  local_1b8.m_log = pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Modifying EGLImage with gl.texSubImage2D");
  tcu::MessageBuilder::operator<<(&local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  tcu::Texture2D::allocLevel(&src,0);
  local_1b8.m_log = (TestLog *)0x0;
  local_1b8.m_str = (ostringstream)0x0;
  local_1b8._9_7_ = 0;
  local_1c8 = (ConstPixelBufferAccess *)0x3f8000003f800000;
  afStack_1c0[0] = 1.0;
  afStack_1c0[1] = 1.0;
  tcu::fillWithComponentGradients
            (src.super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,(Vec4 *)&local_1b8,(Vec4 *)&local_1c8);
  (*gl->bindTexture)(0xde1,srcTex.super_ObjectWrapper.m_object);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"bindTexture(GL_TEXTURE_2D, *srcTex)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x310);
  imageTargetTexture2D
            ((api->super_ImageApi).m_egl,gl,
             ((img->super_UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>).
              m_data.ptr)->m_image);
  (*gl->texSubImage2D)
            (0xde1,0,8,0x10,src.m_width,src.m_height,this->m_format,this->m_type,
             ((src.super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).m_data);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,
                  "texSubImage2D(GL_TEXTURE_2D, 0, xOffset, yOffset, src.getWidth(), src.getHeight(), m_format, m_type, src.getLevel(0).getDataPtr())"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x312);
  (*gl->bindTexture)(0xde1,0);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"bindTexture(GL_TEXTURE_2D, 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x313);
  (*gl->finish)();
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"finish()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x314);
  tcu::getSubregion((PixelBufferAccess *)&local_1b8,
                    (reference->super_TextureLevelPyramid).m_access.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,8,0x10,0,width,height,1);
  tcu::copy((EVP_PKEY_CTX *)&local_1b8,
            (EVP_PKEY_CTX *)
            src.super_TextureLevelPyramid.m_access.
            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
            _M_impl.super__Vector_impl_data._M_start);
  tcu::Texture3D::~Texture3D((Texture3D *)&src);
  glu::ObjectWrapper::~ObjectWrapper(&srcTex.super_ObjectWrapper);
  return true;
}

Assistant:

bool GLES2ImageApi::ModifyTexSubImage::invokeGLES2 (GLES2ImageApi& api, MovePtr<UniqueImage>& img, tcu::Texture2D& reference) const
{
	const glw::Functions&	gl		= api.m_gl;
	tcu::TestLog&			log		= api.getLog();
	glu::Texture			srcTex	(gl);
	const int				xOffset	= 8;
	const int				yOffset	= 16;
	const int				xSize	= de::clamp(16, 0, reference.getWidth() - xOffset);
	const int				ySize	= de::clamp(16, 0, reference.getHeight() - yOffset);
	tcu::Texture2D			src		(glu::mapGLTransferFormat(m_format, m_type), xSize, ySize);

	log << tcu::TestLog::Message << "Modifying EGLImage with gl.texSubImage2D" << tcu::TestLog::EndMessage;

	src.allocLevel(0);
	tcu::fillWithComponentGradients(src.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));

	GLU_CHECK_GLW_CALL(gl, bindTexture(GL_TEXTURE_2D, *srcTex));
	imageTargetTexture2D(api.m_egl, gl, **img);
	GLU_CHECK_GLW_CALL(gl, texSubImage2D(GL_TEXTURE_2D, 0, xOffset, yOffset, src.getWidth(), src.getHeight(), m_format, m_type, src.getLevel(0).getDataPtr()));
	GLU_CHECK_GLW_CALL(gl, bindTexture(GL_TEXTURE_2D, 0));
	GLU_CHECK_GLW_CALL(gl, finish());

	tcu::copy(tcu::getSubregion(reference.getLevel(0), xOffset, yOffset, 0, xSize, ySize, 1), src.getLevel(0));

	return true;
}